

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_libinfo.c
# Opt level: O3

CURLcode get_libcurl_info(void)

{
  char **ppcVar1;
  char **ppcVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  proto_name_pattern *ppVar6;
  
  curlinfo = (curl_version_info_data *)curl_version_info(7);
  if (curlinfo == (curl_version_info_data *)0x0) {
    CVar4 = CURLE_FAILED_INIT;
  }
  else {
    built_in_protos = 0;
    ppcVar2 = curlinfo->protocols;
    CVar4 = CURLE_OK;
    if (ppcVar2 != (char **)0x0) {
      pcVar5 = *ppcVar2;
      while (CVar4 = CURLE_OK, pcVar5 != (char *)0x0) {
        ppVar6 = get_libcurl_info::possibly_built_in;
        pcVar5 = "dict";
        do {
          ppVar6 = ppVar6 + 1;
          iVar3 = curl_strequal(*ppcVar2,pcVar5);
          if (iVar3 != 0) {
            built_in_protos = built_in_protos | ppVar6[-1].proto_pattern;
            break;
          }
          pcVar5 = ppVar6->proto_name;
        } while (pcVar5 != (char *)0x0);
        ppcVar1 = ppcVar2 + 1;
        ppcVar2 = ppcVar2 + 1;
        pcVar5 = *ppcVar1;
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode get_libcurl_info(void)
{
  static struct proto_name_pattern {
    const char *proto_name;
    long        proto_pattern;
  } const possibly_built_in[] = {
    { "dict",   CURLPROTO_DICT   },
    { "file",   CURLPROTO_FILE   },
    { "ftp",    CURLPROTO_FTP    },
    { "ftps",   CURLPROTO_FTPS   },
    { "gopher", CURLPROTO_GOPHER },
    { "http",   CURLPROTO_HTTP   },
    { "https",  CURLPROTO_HTTPS  },
    { "imap",   CURLPROTO_IMAP   },
    { "imaps",  CURLPROTO_IMAPS  },
    { "ldap",   CURLPROTO_LDAP   },
    { "ldaps",  CURLPROTO_LDAPS  },
    { "pop3",   CURLPROTO_POP3   },
    { "pop3s",  CURLPROTO_POP3S  },
    { "rtmp",   CURLPROTO_RTMP   },
    { "rtsp",   CURLPROTO_RTSP   },
    { "scp",    CURLPROTO_SCP    },
    { "sftp",   CURLPROTO_SFTP   },
    { "smb",    CURLPROTO_SMB    },
    { "smbs",   CURLPROTO_SMBS   },
    { "smtp",   CURLPROTO_SMTP   },
    { "smtps",  CURLPROTO_SMTPS  },
    { "telnet", CURLPROTO_TELNET },
    { "tftp",   CURLPROTO_TFTP   },
    {  NULL,    0                }
  };

  const char *const *proto;

  /* Pointer to libcurl's run-time version information */
  curlinfo = curl_version_info(CURLVERSION_NOW);
  if(!curlinfo)
    return CURLE_FAILED_INIT;

  /* Build CURLPROTO_* bit pattern with libcurl's built-in protocols */
  built_in_protos = 0;
  if(curlinfo->protocols) {
    for(proto = curlinfo->protocols; *proto; proto++) {
      struct proto_name_pattern const *p;
      for(p = possibly_built_in; p->proto_name; p++) {
        if(curl_strequal(*proto, p->proto_name)) {
          built_in_protos |= p->proto_pattern;
          break;
        }
      }
    }
  }

  return CURLE_OK;
}